

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

int read_file(char *filename,int merge)

{
  int iVar1;
  Fl_Type *local_28;
  Fl_Type *o;
  int merge_local;
  char *filename_local;
  
  read_version = 0.0;
  iVar1 = open_read(filename);
  if (iVar1 == 0) {
    filename_local._4_4_ = 0;
  }
  else {
    if (merge == 0) {
      delete_all(0);
    }
    else {
      deselect();
    }
    read_children(Fl_Type::current,merge);
    Fl_Type::current = (Fl_Type *)0x0;
    for (local_28 = Fl_Type::first; local_28 != (Fl_Type *)0x0; local_28 = local_28->next) {
      iVar1 = (*local_28->_vptr_Fl_Type[0x1f])();
      if (iVar1 != 0) {
        (*local_28->_vptr_Fl_Type[8])(local_28,0);
      }
    }
    for (local_28 = Fl_Type::first; local_28 != (Fl_Type *)0x0; local_28 = local_28->next) {
      if (local_28->selected != '\0') {
        Fl_Type::current = local_28;
        break;
      }
    }
    selection_changed(Fl_Type::current);
    filename_local._4_4_ = close_read();
  }
  return filename_local._4_4_;
}

Assistant:

int read_file(const char *filename, int merge) {
  Fl_Type *o;
  read_version = 0.0;
  if (!open_read(filename)) return 0;
  if (merge) deselect(); else    delete_all();
  read_children(Fl_Type::current, merge);
  Fl_Type::current = 0;
  // Force menu items to be rebuilt...
  for (o = Fl_Type::first; o; o = o->next)
    if (o->is_menu_button()) o->add_child(0,0);
  for (o = Fl_Type::first; o; o = o->next)
    if (o->selected) {Fl_Type::current = o; break;}
  selection_changed(Fl_Type::current);
  return close_read();
}